

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pssize p_socket_send_to(PSocket *socket,PSocketAddress *address,pchar *buffer,psize buflen,
                       PError **error)

{
  pboolean pVar1;
  pint err_code;
  PErrorIO code;
  psize pVar2;
  ssize_t sVar3;
  char *message;
  sockaddr_storage sa;
  
  if ((address == (PSocketAddress *)0x0 || socket == (PSocket *)0x0) || buffer == (pchar *)0x0) {
    message = "Invalid input argument";
    code = P_ERROR_IO_INVALID_ARGUMENT;
    err_code = 0;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      return -1;
    }
    pVar1 = p_socket_address_to_native(address,&sa,0x80);
    if (pVar1 == 0) {
      p_error_set_error_p(error,0x20a,0,"Failed to convert socket address to native structure");
      return -1;
    }
    pVar2 = p_socket_address_get_native_size(address);
    do {
      if (((socket->field_0x18 & 1) != 0) &&
         (pVar1 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLOUT,error), pVar1 == 0
         )) {
        return -1;
      }
      sVar3 = sendto(socket->fd,buffer,buflen & 0xffffffff,0,(sockaddr *)&sa,(socklen_t)pVar2);
      if (-1 < sVar3) {
        return sVar3;
      }
      err_code = p_error_get_last_net();
    } while ((err_code == 4) ||
            ((code = p_error_get_io_from_system(err_code), (socket->field_0x18 & 1) != 0 &&
             (code == P_ERROR_IO_WOULD_BLOCK))));
    message = "Failed to call sendto() on socket";
  }
  p_error_set_error_p(error,code,err_code,message);
  return -1;
}

Assistant:

P_LIB_API pssize
p_socket_send_to (const PSocket		*socket,
		  PSocketAddress	*address,
		  const pchar		*buffer,
		  psize			buflen,
		  PError		**error)
{
	PErrorIO		sock_err;
	struct sockaddr_storage sa;
	socklen_t		optlen;
	pssize			ret;
	pint			err_code;

	if (!socket || !address || !buffer) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (!pp_socket_check (socket, error))
		return -1;

	if (!p_socket_address_to_native (address, &sa, sizeof (sa))) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to convert socket address to native structure");
		return -1;
	}

	optlen = (socklen_t) p_socket_address_get_native_size (address);

	for (;;) {
		if (socket->blocking &&
		    p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLOUT, error) == FALSE)
			return -1;

		if ((ret = sendto (socket->fd,
				   buffer,
				   (socklen_t) buflen,
				   0,
				   (struct sockaddr *) &sa,
				   optlen)) < 0) {
			err_code = p_error_get_last_net ();

#if !defined (P_OS_WIN) && defined (EINTR)
			if (err_code == EINTR)
				continue;
#endif
			sock_err = p_error_get_io_from_system (err_code);

			if (socket->blocking && sock_err == P_ERROR_IO_WOULD_BLOCK)
				continue;

			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Failed to call sendto() on socket");

			return -1;
		}

		break;
	}

	return ret;
}